

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * __thiscall
pbrt::Image::ConvertToFormat(Image *this,PixelFormat newFormat,ColorEncodingHandle *encoding)

{
  Point2i p;
  WrapMode2D wrapMode;
  Point2i p_00;
  int iVar1;
  int in_EDX;
  int *in_RSI;
  Image *in_RDI;
  ColorEncodingHandle *in_stack_00000050;
  PixelFormat in_stack_0000005c;
  Image *in_stack_00000060;
  Allocator in_stack_00000068;
  int c;
  int x;
  int y;
  Tuple2<pbrt::Point2,_int> in_stack_00000080;
  Image *newImage;
  ColorEncodingHandle *in_stack_ffffffffffffff38;
  undefined8 uVar2;
  Float in_stack_ffffffffffffff40;
  WrapMode in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  WrapMode w;
  undefined4 in_stack_ffffffffffffff50;
  WrapMode local_5c;
  int local_58;
  int local_54;
  Float in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Image *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  WrapMode in_stack_ffffffffffffffc4;
  WrapMode in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (in_EDX == *in_RSI) {
    Image((Image *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          (Image *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    pstd::span<std::__cxx11::string_const>::
    span<pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,void,pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),
               (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    uVar2 = CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    Image(in_stack_00000060,in_stack_0000005c,(Point2i)in_stack_00000080,
          (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           )_x,in_stack_00000050,in_stack_00000068);
    for (local_54 = 0; local_54 < in_RSI[2]; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < in_RSI[1]; local_58 = local_58 + 1) {
        local_5c = Repeat;
        while (w = local_5c, iVar1 = NChannels((Image *)0x8727aa), (int)w < iVar1) {
          Point2<int>::Point2((Point2<int> *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (int)((ulong)uVar2 >> 0x20),(int)uVar2);
          Point2<int>::Point2((Point2<int> *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (int)((ulong)uVar2 >> 0x20),(int)uVar2);
          in_stack_ffffffffffffff44 = local_5c;
          WrapMode2D::WrapMode2D((WrapMode2D *)CONCAT44(in_EDX,iVar1),w);
          p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffffd0;
          p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffffcc;
          wrapMode.wrap.values[1] = in_stack_ffffffffffffffc8;
          wrapMode.wrap.values[0] = in_stack_ffffffffffffffc4;
          in_stack_ffffffffffffff40 =
               GetChannel(in_stack_ffffffffffffffb8,p_00,in_stack_ffffffffffffffb4,wrapMode);
          p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffffc4;
          p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffffc0;
          SetChannel(in_stack_ffffffffffffffb8,p,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0
                    );
          local_5c = local_5c + Black;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Image Image::ConvertToFormat(PixelFormat newFormat, ColorEncodingHandle encoding) const {
    if (newFormat == format)
        return *this;

    Image newImage(newFormat, resolution, channelNames, encoding);
    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            for (int c = 0; c < NChannels(); ++c)
                newImage.SetChannel({x, y}, c, GetChannel({x, y}, c));
    return newImage;
}